

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hh
# Opt level: O0

string * __thiscall
kratos::Generator::external_filename_abi_cxx11_(string *__return_storage_ptr__,Generator *this)

{
  bool bVar1;
  const_reference pvVar2;
  allocator<char> local_19;
  Generator *local_18;
  Generator *this_local;
  
  local_18 = this;
  this_local = (Generator *)__return_storage_ptr__;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->lib_files_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->lib_files_,0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string external_filename() const { return lib_files_.empty() ? "" : lib_files_[0]; }